

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

void * index_tree_locate(index_tree *tree,lzma_vli target)

{
  index_tree_node *local_28;
  index_tree_node *node;
  index_tree_node *result;
  lzma_vli target_local;
  index_tree *tree_local;
  
  node = (index_tree_node *)0x0;
  local_28 = tree->root;
  if ((tree->leftmost != (index_tree_node *)0x0) && (tree->leftmost->uncompressed_base != 0)) {
    __assert_fail("tree->leftmost == NULL || tree->leftmost->uncompressed_base == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                  ,0x141,"void *index_tree_locate(const index_tree *, lzma_vli)");
  }
  while (local_28 != (index_tree_node *)0x0) {
    if (target < local_28->uncompressed_base) {
      local_28 = local_28->left;
    }
    else {
      node = local_28;
      local_28 = local_28->right;
    }
  }
  return node;
}

Assistant:

static void *
index_tree_locate(const index_tree *tree, lzma_vli target)
{
	const index_tree_node *result = NULL;
	const index_tree_node *node = tree->root;

	assert(tree->leftmost == NULL
			|| tree->leftmost->uncompressed_base == 0);

	// Consecutive nodes may have the same uncompressed_base.
	// We must pick the rightmost one.
	while (node != NULL) {
		if (node->uncompressed_base > target) {
			node = node->left;
		} else {
			result = node;
			node = node->right;
		}
	}

	return (void *)(result);
}